

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O2

StringRef llvm::sys::getHostCPUName(void)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  uint in_XCR0;
  StringRef SVar18;
  char local_34;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar7 = *puVar1;
  sVar10 = 7;
  pcVar11 = "generic";
  if (uVar7 == 0) goto LAB_00172981;
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar12 = *puVar2;
  uVar9 = puVar2[3];
  uVar13 = uVar12 >> 8 & 0xf;
  uVar14 = uVar12 >> 4 & 0xf;
  if (uVar13 == 6) {
LAB_001725c4:
    uVar14 = uVar14 | uVar12 >> 0xc & 0xf0;
  }
  else if (uVar13 == 0xf) {
    uVar13 = (uVar12 >> 0x14 & 0xff) + 0xf;
    goto LAB_001725c4;
  }
  uVar12 = puVar2[2] >> 0x16 & 0x1a | uVar9 >> 0xc & 0x180 | uVar9 >> 3 & 0x40 | (uVar9 & 1) << 5;
  bVar16 = false;
  if (((~uVar9 & 0x18000000) == 0) && ((~in_XCR0 & 6) == 0)) {
    uVar12 = uVar12 | 0x200;
    bVar16 = (~in_XCR0 & 0xe6) == 0;
    bVar17 = true;
  }
  else {
    bVar17 = false;
  }
  uVar15 = uVar9 >> 0x16 & 1;
  if (uVar7 < 7) {
    bVar17 = true;
  }
  else {
    lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar8 = *(uint *)(lVar4 + 4);
    uVar9 = *(uint *)(lVar4 + 0xc);
    uVar6 = uVar12 + 0x400;
    if (!bVar17) {
      uVar6 = uVar12;
    }
    if ((uVar8 & 0x20) == 0) {
      uVar6 = uVar12;
    }
    uVar5 = uVar6 + 0x1000000;
    if (!bVar16) {
      uVar5 = uVar6;
    }
    if ((uVar8 >> 0x1b & 1) == 0) {
      uVar5 = uVar6;
    }
    if (bVar16) {
      uVar6 = uVar5;
    }
    uVar12 = uVar6;
    if ((uVar8 >> 0x1c & 1) == 0) {
      uVar12 = uVar5;
    }
    uVar15 = uVar15 | uVar8 >> 0x14 & 8 | uVar8 >> 0x12 & 2 | uVar8 >> 0x19 & 0x10;
    bVar17 = -1 < (int)uVar8;
  }
  if (6 < uVar7) {
    uVar7 = uVar12 | 0x100000;
    if (!bVar16) {
      uVar7 = uVar12;
    }
    if (bVar17) {
      uVar7 = uVar12;
    }
    uVar8 = uVar7 | 0x4000000;
    if (!bVar16) {
      uVar8 = uVar12;
    }
    if ((uVar9 & 2) == 0) {
      uVar8 = uVar7;
    }
    if (bVar16) {
      uVar12 = uVar8;
    }
    if ((uVar9 >> 0xe & 1) == 0) {
      uVar12 = uVar8;
    }
  }
  puVar3 = (uint *)cpuid(0x80000000);
  if (0x80000000 < *puVar3) {
    lVar4 = cpuid(0x80000001);
    uVar15 = uVar15 | *(uint *)(lVar4 + 8) >> 0x1b & 4;
  }
  if (puVar1[1] == 0x68747541) {
    switch(uVar13) {
    case 4:
switchD_00172759_caseD_4:
      pcVar11 = "i486";
LAB_00172789:
      sVar10 = 4;
      break;
    case 5:
      uVar14 = uVar14 - 6;
      if (uVar14 < 8) {
        pcVar11 = &DAT_001d97e0 + *(int *)(&DAT_001d97e0 + (ulong)uVar14 * 4);
        sVar10 = *(size_t *)(&DAT_001d9800 + (ulong)uVar14 * 8);
      }
      else {
        pcVar11 = "pentium";
      }
      break;
    case 6:
      pcVar11 = "athlon-xp";
      if ((uVar12 & 8) == 0) {
        pcVar11 = "athlon";
      }
      sVar10 = (ulong)((uVar12 & 8) >> 3) * 3 + 6;
      break;
    case 0xf:
      pcVar11 = "k8-sse3";
      if ((uVar12 & 0x20) == 0) {
        pcVar11 = "k8";
      }
      sVar10 = (ulong)((uVar12 & 0x20) >> 5) * 5 + 2;
      break;
    case 0x10:
      sVar10 = 8;
      pcVar11 = "amdfam10";
      break;
    case 0x14:
      sVar10 = 6;
      pcVar11 = "btver1";
      break;
    case 0x15:
      sVar10 = 6;
      if ((uVar14 & 0xffffffe0) == 0x60) {
        pcVar11 = "bdver4";
      }
      else if ((uVar14 & 0xfffffff0) == 0x30) {
        pcVar11 = "bdver3";
      }
      else {
        pcVar11 = "bdver1";
        if ((uVar14 & 0xfffffff0) == 0x10) {
          pcVar11 = "bdver2";
        }
        if (uVar14 == 2) {
          pcVar11 = "bdver2";
        }
      }
      break;
    case 0x16:
      sVar10 = 6;
      pcVar11 = "btver2";
      break;
    case 0x17:
      sVar10 = 6;
      pcVar11 = "znver1";
    }
  }
  else if ((puVar1[1] == 0x756e6547) && (local_34 = (char)puVar2[1], local_34 == '\0')) {
    switch(uVar13) {
    case 3:
      pcVar11 = "i386";
      goto LAB_00172789;
    case 4:
      goto switchD_00172759_caseD_4;
    case 5:
      pcVar11 = "pentium-mmx";
      if ((uVar12 & 2) == 0) {
        pcVar11 = "pentium";
      }
      sVar10 = (ulong)(uVar12 & 2) * 2 + 7;
      break;
    case 6:
      pcVar11 = "nehalem";
      switch(uVar14) {
      case 1:
switchD_00172915_caseD_1:
        sVar10 = 10;
        pcVar11 = "pentiumpro";
        break;
      case 2:
      case 4:
      case 0xc:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x18:
      case 0x19:
      case 0x1b:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x28:
      case 0x29:
      case 0x2b:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x38:
      case 0x39:
      case 0x3b:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x48:
      case 0x49:
      case 0x4b:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x58:
      case 0x59:
      case 0x5b:
      case 0x60:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x78:
      case 0x79:
      case 0x7b:
      case 0x7c:
      case 0x7d:
      case 0x7e:
      case 0x7f:
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x83:
      case 0x84:
switchD_00172915_caseD_2:
        if (uVar12 >> 0x1a != 0) goto switchD_00172915_caseD_66;
        if ((uVar12 >> 0x14 & 1) != 0) goto switchD_00172915_caseD_55;
        if ((uVar12 >> 0x18 & 1) != 0) goto switchD_00172915_caseD_57;
        if ((uVar15 & 8) != 0) {
          if ((uVar15 & 0x10) == 0) goto switchD_00172915_caseD_4e;
          goto switchD_00172915_caseD_5c;
        }
        if ((uVar15 & 2) != 0) goto switchD_00172915_caseD_3d;
        if ((uVar12 >> 10 & 1) != 0) goto switchD_00172915_caseD_3c;
        if ((uVar12 >> 9 & 1) != 0) goto switchD_00172915_caseD_2a;
        if ((uVar12 >> 8 & 1) == 0) {
          if ((char)uVar12 < '\0') goto switchD_00172915_caseD_17;
          if ((uVar12 & 0x40) == 0) {
            if ((uVar15 & 4) == 0) {
              if ((uVar12 & 0x20) != 0) goto switchD_00172915_caseD_e;
              if ((uVar12 & 0x10) != 0) goto switchD_00172915_caseD_9;
              if ((uVar12 & 8) != 0) goto switchD_00172915_caseD_7;
              if ((uVar12 & 2) != 0) goto switchD_00172915_caseD_3;
              goto switchD_00172915_caseD_1;
            }
          }
          else if ((uVar15 & 1) != 0) goto switchD_00172915_caseD_1c;
          goto switchD_00172915_caseD_f;
        }
        if ((uVar15 & 1) != 0) goto switchD_00172915_caseD_37;
        break;
      case 3:
      case 5:
      case 6:
switchD_00172915_caseD_3:
        sVar10 = 8;
        pcVar11 = "pentium2";
        break;
      case 7:
      case 8:
      case 10:
      case 0xb:
switchD_00172915_caseD_7:
        sVar10 = 8;
        pcVar11 = "pentium3";
        break;
      case 9:
      case 0xd:
      case 0x15:
switchD_00172915_caseD_9:
        sVar10 = 9;
        pcVar11 = "pentium-m";
        break;
      case 0xe:
switchD_00172915_caseD_e:
        sVar10 = 5;
        pcVar11 = "yonah";
        break;
      case 0xf:
      case 0x16:
switchD_00172915_caseD_f:
        sVar10 = 5;
        pcVar11 = "core2";
        break;
      case 0x17:
      case 0x1d:
switchD_00172915_caseD_17:
        sVar10 = 6;
        pcVar11 = "penryn";
        break;
      case 0x1a:
      case 0x1e:
      case 0x1f:
      case 0x2e:
        break;
      case 0x1c:
      case 0x26:
      case 0x27:
      case 0x35:
      case 0x36:
switchD_00172915_caseD_1c:
        pcVar11 = "bonnell";
        break;
      case 0x25:
      case 0x2c:
      case 0x2f:
        sVar10 = 8;
        pcVar11 = "westmere";
        break;
      case 0x2a:
      case 0x2d:
switchD_00172915_caseD_2a:
        sVar10 = 0xb;
        pcVar11 = "sandybridge";
        break;
      case 0x37:
      case 0x4a:
      case 0x4c:
      case 0x4d:
      case 0x5a:
      case 0x5d:
switchD_00172915_caseD_37:
        sVar10 = 10;
        pcVar11 = "silvermont";
        break;
      case 0x3a:
      case 0x3e:
        sVar10 = 9;
        pcVar11 = "ivybridge";
        break;
      case 0x3c:
      case 0x3f:
      case 0x45:
      case 0x46:
switchD_00172915_caseD_3c:
        pcVar11 = "haswell";
        break;
      case 0x3d:
      case 0x47:
      case 0x4f:
      case 0x56:
switchD_00172915_caseD_3d:
        sVar10 = 9;
        pcVar11 = "broadwell";
        break;
      case 0x55:
switchD_00172915_caseD_55:
        sVar10 = 0xe;
        pcVar11 = "skylake-avx512";
        break;
      case 0x57:
switchD_00172915_caseD_57:
        sVar10 = 3;
        pcVar11 = "knl";
        break;
      case 0x5c:
      case 0x5f:
switchD_00172915_caseD_5c:
        sVar10 = 8;
        pcVar11 = "goldmont";
        break;
      case 0x66:
switchD_00172915_caseD_66:
        sVar10 = 10;
        pcVar11 = "cannonlake";
        break;
      case 0x7a:
        sVar10 = 0xd;
        pcVar11 = "goldmont-plus";
        break;
      case 0x85:
        sVar10 = 3;
        pcVar11 = "knm";
        break;
      default:
        if ((uVar14 != 0x8e) && (uVar14 != 0x9e)) goto switchD_00172915_caseD_2;
      case 0x4e:
      case 0x5e:
switchD_00172915_caseD_4e:
        pcVar11 = "skylake";
      }
      break;
    default:
      if (uVar13 == 0xf) {
        if ((uVar15 & 4) == 0) {
          pcVar11 = "prescott";
          if ((uVar12 & 0x20) == 0) {
            pcVar11 = "pentium4";
          }
          sVar10 = 8;
        }
        else {
          sVar10 = 6;
          pcVar11 = "nocona";
        }
      }
    }
  }
LAB_00172981:
  SVar18.Length = sVar10;
  SVar18.Data = pcVar11;
  return SVar18;
}

Assistant:

static bool getX86CpuIDAndInfo(unsigned value, unsigned *rEAX, unsigned *rEBX,
                               unsigned *rECX, unsigned *rEDX) {
#if defined(__GNUC__) || defined(__clang__)
#if defined(__x86_64__)
  // gcc doesn't know cpuid would clobber ebx/rbx. Preserve it manually.
  // FIXME: should we save this for Clang?
  __asm__("movq\t%%rbx, %%rsi\n\t"
          "cpuid\n\t"
          "xchgq\t%%rbx, %%rsi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#elif defined(__i386__)
  __asm__("movl\t%%ebx, %%esi\n\t"
          "cpuid\n\t"
          "xchgl\t%%ebx, %%esi\n\t"
          : "=a"(*rEAX), "=S"(*rEBX), "=c"(*rECX), "=d"(*rEDX)
          : "a"(value));
  return false;
#else
  return true;
#endif
#elif defined(_MSC_VER)
  // The MSVC intrinsic is portable across x86 and x64.
  int registers[4];
  __cpuid(registers, value);
  *rEAX = registers[0];
  *rEBX = registers[1];
  *rECX = registers[2];
  *rEDX = registers[3];
  return false;
#else
  return true;
#endif
}